

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::renderTestPatternReference(PixelBufferAccess *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TextureFormat TVar5;
  int y;
  int y_00;
  int iVar6;
  int x;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> rects;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> local_68;
  tcu local_40 [16];
  
  tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_68,dst,MODE_STENCIL);
  tcu::getTextureFormatBitDepth(local_40,(TextureFormat *)&local_68);
  local_68.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((dst->super_ConstPixelBufferAccess).m_format.order == DS) {
    tcu::clearDepth(dst,0.0);
  }
  tcu::clearStencil(dst,0);
  genTestRects(&local_68,(dst->super_ConstPixelBufferAccess).m_size.m_data[0],
               (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
  if (local_68.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    TVar5 = (TextureFormat)
            local_68.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      y_00 = *(int *)((long)TVar5 + 4);
      iVar3 = *(int *)((long)TVar5 + 0xc) + y_00;
      if (y_00 < iVar3) {
        iVar1 = *(int *)TVar5;
        iVar2 = *(int *)((long)TVar5 + 8);
        do {
          x = iVar1;
          iVar6 = iVar2;
          if (iVar1 < iVar2 + iVar1) {
            do {
              iVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                                (&dst->super_ConstPixelBufferAccess,x,y_00,0);
              tcu::PixelBufferAccess::setPixStencil
                        (dst,iVar4 + 1U & ~(-1 << ((byte)local_40[0] & 0x1f)),x,y_00,0);
              x = x + 1;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          y_00 = y_00 + 1;
        } while (y_00 != iVar3);
      }
      TVar5 = (TextureFormat)((long)TVar5 + 0x10);
    } while (TVar5 != (TextureFormat)
                      local_68.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((TextureFormat)
      local_68.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (TextureFormat)0x0) {
    operator_delete(local_68.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void renderTestPatternReference (const tcu::PixelBufferAccess& dst)
{
	const int		stencilBits		= tcu::getTextureFormatBitDepth(tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_STENCIL).getFormat()).x();
	const deUint32	stencilMask		= (1u<<stencilBits)-1u;
	vector<IVec4>	rects;

	DE_ASSERT(dst.getFormat().order == TextureFormat::S || dst.getFormat().order == TextureFormat::DS);

	// clear depth and stencil
	if (dst.getFormat().order == TextureFormat::DS)
		tcu::clearDepth(dst, 0.0f);
	tcu::clearStencil(dst, 0u);

	genTestRects(rects, dst.getWidth(), dst.getHeight());

	for (vector<IVec4>::const_iterator rectIter = rects.begin(); rectIter != rects.end(); ++rectIter)
	{
		const int	x0		= rectIter->x();
		const int	y0		= rectIter->y();
		const int	x1		= x0+rectIter->z();
		const int	y1		= y0+rectIter->w();

		for (int y = y0; y < y1; y++)
		{
			for (int x = x0; x < x1; x++)
			{
				const int oldVal	= dst.getPixStencil(x, y);
				const int newVal	= (oldVal+1)&stencilMask;

				dst.setPixStencil(newVal, x, y);
			}
		}
	}
}